

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialogPrivate::ensureListView(QInputDialogPrivate *this)

{
  QWidget *parent;
  QInputDialogListView *pQVar1;
  void **ppvVar2;
  QWidget *this_00;
  QAbstractItemModel *pQVar3;
  QItemSelectionModel *pQVar4;
  undefined4 *puVar5;
  long in_FS_OFFSET;
  QObject local_60 [8];
  code *local_58;
  quintptr local_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  code *local_40;
  ImplFn local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->listView == (QInputDialogListView *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    ensureComboBox(this);
    this_00 = (QWidget *)operator_new(0x28);
    QListView::QListView((QListView *)this_00,parent);
    *(undefined ***)this_00 = &PTR_metaObject_008121c8;
    *(undefined ***)&this_00->super_QPaintDevice = &PTR__QInputDialogListView_008124d8;
    this->listView = (QInputDialogListView *)this_00;
    QWidget::hide(this_00);
    QAbstractItemView::setEditTriggers((QAbstractItemView *)this->listView,(EditTriggers)0x0);
    QAbstractItemView::setSelectionMode((QAbstractItemView *)this->listView,SingleSelection);
    pQVar1 = this->listView;
    pQVar3 = QComboBox::model(this->comboBox);
    (**(code **)(*(long *)&(pQVar1->super_QListView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
              (pQVar1,pQVar3);
    local_58 = (code *)0xffffffffffffffff;
    local_50 = 0;
    tStack_48.ptr = (QAbstractItemModel *)0x0;
    QAbstractItemView::setCurrentIndex((QAbstractItemView *)this->listView,(QModelIndex *)&local_58)
    ;
    pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)this->listView);
    local_58 = QItemSelectionModel::currentRowChanged;
    local_50 = 0;
    local_40 = currentRowChanged;
    local_38 = (ImplFn)0x0;
    ppvVar2 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QInputDialogPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar5 + 4) = currentRowChanged;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)pQVar4,(QObject *)&local_58,ppvVar2,(QSlotObjectBase *)&local_40,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureListView()
{
    Q_Q(QInputDialog);
    if (!listView) {
        ensureComboBox();
        listView = new QInputDialogListView(q);
        listView->hide();
        listView->setEditTriggers(QAbstractItemView::NoEditTriggers);
        listView->setSelectionMode(QAbstractItemView::SingleSelection);
        listView->setModel(comboBox->model());
        listView->setCurrentIndex(QModelIndex()); // ###
        QObjectPrivate::connect(listView->selectionModel(),
                                &QItemSelectionModel::currentRowChanged,
                                this, &QInputDialogPrivate::currentRowChanged);
    }
}